

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::~IRContext(IRContext *this)

{
  _Manager_type p_Var1;
  
  spvContextDestroy(this->syntax_context_);
  std::
  unique_ptr<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  ::~unique_ptr(&this->liveness_mgr_);
  std::
  unique_ptr<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  ::~unique_ptr(&this->struct_cfg_analysis_);
  std::
  unique_ptr<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
  ::~unique_ptr(&this->inst_folder_);
  std::
  unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ::~unique_ptr(&this->vn_table_);
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::~unique_ptr(&this->reg_pressure_);
  std::
  unique_ptr<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  ::~unique_ptr(&this->scalar_evolution_analysis_);
  std::
  unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  ::~unique_ptr(&this->id_to_name_);
  std::
  unique_ptr<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  ::~unique_ptr(&this->debug_info_mgr_);
  std::
  unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ::~unique_ptr(&this->type_mgr_);
  std::
  unique_ptr<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
  ::~unique_ptr(&this->constant_mgr_);
  std::
  _Hashtable<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->loop_descriptors_)._M_h);
  std::
  _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
  ::~_Rb_tree(&(this->post_dominator_trees_)._M_t);
  std::
  _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
  ::~_Rb_tree(&(this->dominator_trees_)._M_t);
  std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::~unique_ptr
            (&this->cfg_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->builtin_var_id_map_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->combinator_ops_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->id_to_func_)._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->instr_to_block_)._M_h);
  std::
  unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>::
  ~unique_ptr(&this->feature_mgr_);
  std::
  unique_ptr<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  ::~unique_ptr(&this->decoration_mgr_);
  std::
  unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ::~unique_ptr(&this->def_use_mgr_);
  p_Var1 = (this->consumer_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->consumer_,(_Any_data *)&this->consumer_,__destroy_functor);
  }
  std::unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>::~unique_ptr
            (&this->module_);
  return;
}

Assistant:

~IRContext() { spvContextDestroy(syntax_context_); }